

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format_decode_data_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::objectivec::anon_unknown_0::
ObjCHelper_TextFormatDecodeData_ByteCodes_Test::TestBody
          (ObjCHelper_TextFormatDecodeData_ByteCodes_Test *this)

{
  bool bVar1;
  char *pcVar2;
  AssertHelper local_190;
  Message local_188;
  string local_180;
  undefined1 local_160 [8];
  AssertionResult gtest_ar_1;
  undefined1 local_148 [8];
  string expected;
  uint8_t expected_data [28];
  Message local_100;
  size_t local_f8;
  int local_ec;
  undefined1 local_e8 [8];
  AssertionResult gtest_ar;
  string_view local_c8;
  string_view local_b8;
  string_view local_a8;
  string_view local_98;
  string_view local_88;
  string_view local_78;
  string_view local_68 [2];
  string_view local_48;
  string_view local_38;
  undefined1 local_28 [8];
  TextFormatDecodeData decode_data;
  ObjCHelper_TextFormatDecodeData_ByteCodes_Test *this_local;
  
  decode_data.entries_.
  super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)this;
  TextFormatDecodeData::TextFormatDecodeData((TextFormatDecodeData *)local_28);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_38,"abcdefghIJ");
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_48,"abcdefghIJ");
  TextFormatDecodeData::AddString((TextFormatDecodeData *)local_28,1,local_38,local_48);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(local_68,"abcdefghIJ");
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_78,"_AbcdefghIJ");
  TextFormatDecodeData::AddString((TextFormatDecodeData *)local_28,3,local_68[0],local_78);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_88,"abcdefghIJ");
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_98,"Abcd_EfghIJ");
  TextFormatDecodeData::AddString((TextFormatDecodeData *)local_28,2,local_88,local_98);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_a8,"abcdefghIJ");
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_b8,"ABCD__EfghI_j");
  TextFormatDecodeData::AddString((TextFormatDecodeData *)local_28,4,local_a8,local_b8);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_c8,
             "longFieldNameIsLooooooooooooooooooooooooooooooooooooooooooooooooooooooooooooooooooooooooong1000"
            );
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)&gtest_ar.message_,
             "long_field_name_is_looooooooooooooooooooooooooooooooooooooooooooooooooooooooooooooooooooooooong_1000"
            );
  TextFormatDecodeData::AddString
            ((TextFormatDecodeData *)local_28,1000,local_c8,stack0xffffffffffffff28);
  local_ec = 5;
  local_f8 = TextFormatDecodeData::num_entries((TextFormatDecodeData *)local_28);
  testing::internal::EqHelper::Compare<int,_unsigned_long,_nullptr>
            ((EqHelper *)local_e8,"5","decode_data.num_entries()",&local_ec,&local_f8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_e8);
  if (!bVar1) {
    testing::Message::Message(&local_100);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_e8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)(expected_data + 0x18),kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/objectivec/text_format_decode_data_unittest.cc"
               ,0xa6,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)(expected_data + 0x18),&local_100);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)(expected_data + 0x18));
    testing::Message::~Message(&local_100);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_e8);
  expected_data[8] = '\0';
  expected_data[9] = 0xe8;
  expected_data[10] = '\a';
  expected_data[0xb] = '\x04';
  expected_data[0xc] = 0xa5;
  expected_data[0xd] = 0xa4;
  expected_data[0xe] = 0xa2;
  expected_data[0xf] = 0xbf;
  expected_data[0x10] = '\x1f';
  expected_data[0x11] = '\x0e';
  expected_data[0x12] = 0x84;
  expected_data[0x13] = '\0';
  expected.field_2._8_8_ = 0x200ca03000a0105;
  expected_data[0] = 'D';
  expected_data[1] = 0xc6;
  expected_data[2] = '\0';
  expected_data[3] = '\x04';
  expected_data[4] = 'd';
  expected_data[5] = 0x80;
  expected_data[6] = 0xc5;
  expected_data[7] = 0xa1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)local_148,expected.field_2._M_local_buf + 8,0x1c,
             (allocator *)
             ((long)&gtest_ar_1.message_._M_t.
                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             + 7));
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&gtest_ar_1.message_._M_t.
                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             + 7));
  TextFormatDecodeData::Data_abi_cxx11_(&local_180,(TextFormatDecodeData *)local_28);
  testing::internal::EqHelper::
  Compare<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nullptr>
            ((EqHelper *)local_160,"expected","decode_data.Data()",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_148,
             &local_180);
  std::__cxx11::string::~string((string *)&local_180);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_160);
  if (!bVar1) {
    testing::Message::Message(&local_188);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_160);
    testing::internal::AssertHelper::AssertHelper
              (&local_190,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/objectivec/text_format_decode_data_unittest.cc"
               ,0xbe,pcVar2);
    testing::internal::AssertHelper::operator=(&local_190,&local_188);
    testing::internal::AssertHelper::~AssertHelper(&local_190);
    testing::Message::~Message(&local_188);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_160);
  std::__cxx11::string::~string((string *)local_148);
  TextFormatDecodeData::~TextFormatDecodeData((TextFormatDecodeData *)local_28);
  return;
}

Assistant:

TEST(ObjCHelper, TextFormatDecodeData_ByteCodes) {
  TextFormatDecodeData decode_data;

  decode_data.AddString(1, "abcdefghIJ", "abcdefghIJ");
  decode_data.AddString(3, "abcdefghIJ", "_AbcdefghIJ");
  decode_data.AddString(2, "abcdefghIJ", "Abcd_EfghIJ");
  decode_data.AddString(4, "abcdefghIJ", "ABCD__EfghI_j");
  decode_data.AddString(1000,
                        "longFieldNameIsLoooooooooooooooooooooooooooooooooooooo"
                        "ooooooooooooooooooooooooooooooooooong1000",
                        "long_field_name_is_"
                        "looooooooooooooooooooooooooooooooooooooooooooooooooooo"
                        "oooooooooooooooooooong_1000");

  EXPECT_EQ(5, decode_data.num_entries());

  // clang-format off
  uint8_t expected_data[] = {
      0x5,
      // All as is (00 op)
      0x1,  0x0A, 0x0,
      // Underscore, upper + 9 (10 op)
      0x3,  0xCA, 0x0,
      //  Upper + 3 (10 op), underscore, upper + 5 (10 op)
      0x2,  0x44, 0xC6, 0x0,
      // All Upper for 4 (11 op), underscore, underscore, upper + 5 (10 op),
      // underscore, lower + 0 (01 op)
      0x4,  0x64, 0x80, 0xC5, 0xA1, 0x0,
      // 2 byte key: as is + 3 (00 op), underscore, lower + 4 (01 op),
      //   underscore, lower + 3 (01 op), underscore, lower + 1 (01 op),
      //   underscore, lower + 30 (01 op), as is + 30 (00 op), as is + 13 (00
      //   op),
      //   underscore, as is + 3 (00 op)
      0xE8, 0x07, 0x04, 0xA5, 0xA4, 0xA2, 0xBF, 0x1F, 0x0E, 0x84, 0x0,
  };
  // clang-format on
  std::string expected((const char*)expected_data, sizeof(expected_data));

  EXPECT_EQ(expected, decode_data.Data());
}